

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O3

bool pbrt::ToGrid(Point3f *p,Bounds3f *bounds,int *gridRes,Point3i *pi)

{
  int *piVar1;
  int *piVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  ulong uVar6;
  undefined4 uVar7;
  float fVar8;
  undefined8 uVar9;
  bool bVar10;
  undefined1 auVar11 [12];
  bool bVar12;
  int *piVar13;
  int i;
  int iVar14;
  long lVar15;
  int iVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  uVar6._0_4_ = (bounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
  uVar6._4_4_ = (bounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar6;
  fVar3 = (bounds->pMax).super_Tuple3<pbrt::Point3,_float>.x;
  uVar5 = (p->super_Tuple3<pbrt::Point3,_float>).x;
  uVar7 = (p->super_Tuple3<pbrt::Point3,_float>).y;
  auVar18._4_4_ = uVar7;
  auVar18._0_4_ = uVar5;
  auVar18._8_8_ = 0;
  fVar4 = (bounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
  auVar19 = vsubps_avx(auVar18,auVar21);
  if ((float)(undefined4)uVar6 < fVar3) {
    auVar11 = auVar19._4_12_;
    auVar19._0_4_ = auVar19._0_4_ / (fVar3 - (float)(undefined4)uVar6);
    auVar19._4_12_ = auVar11;
  }
  fVar3 = (bounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
  auVar18 = vmovshdup_avx(auVar21);
  fVar8 = (p->super_Tuple3<pbrt::Point3,_float>).z - fVar4;
  if (auVar18._0_4_ < fVar3) {
    auVar21 = vmovshdup_avx(auVar19);
    auVar22._0_4_ = auVar21._0_4_ / (fVar3 - auVar18._0_4_);
    auVar22._4_12_ = auVar21._4_12_;
    auVar19 = vinsertps_avx(auVar19,auVar22,0x10);
  }
  fVar3 = (bounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
  piVar1 = &(pi->super_Tuple3<pbrt::Point3,_int>).y;
  piVar2 = &(pi->super_Tuple3<pbrt::Point3,_int>).z;
  bVar12 = true;
  lVar15 = 0;
  uVar9 = vcmpss_avx512f(ZEXT416((uint)fVar4),ZEXT416((uint)fVar3),1);
  bVar10 = (bool)((byte)uVar9 & 1);
  auVar18 = vmovshdup_avx(auVar19);
  do {
    iVar14 = (int)lVar15;
    piVar13 = (int *)pi;
    fVar20 = auVar19._0_4_;
    if ((iVar14 != 0) && (piVar13 = piVar1, fVar20 = auVar18._0_4_, iVar14 != 1)) {
      piVar13 = piVar2;
      fVar20 = (float)((uint)bVar10 * (int)(fVar8 / (fVar3 - fVar4)) + (uint)!bVar10 * (int)fVar8);
    }
    iVar16 = gridRes[lVar15];
    *piVar13 = (int)(fVar20 * (float)iVar16);
    if ((int)(fVar20 * (float)iVar16) < 0) {
      bVar17 = false;
    }
    else {
      piVar13 = (int *)pi;
      if ((iVar14 != 0) && (piVar13 = piVar1, iVar14 != 1)) {
        piVar13 = piVar2;
      }
      bVar17 = *piVar13 < gridRes[lVar15];
    }
    piVar13 = (int *)pi;
    if ((iVar14 != 0) && (piVar13 = piVar1, iVar14 != 1)) {
      piVar13 = piVar2;
    }
    bVar12 = (bool)(bVar12 & bVar17);
    iVar14 = *piVar13;
    iVar16 = gridRes[lVar15] + -1;
    if (iVar14 < gridRes[lVar15] + -1) {
      iVar16 = iVar14;
    }
    if (iVar14 < 0) {
      iVar16 = 0;
    }
    lVar15 = lVar15 + 1;
    *piVar13 = iVar16;
  } while (lVar15 != 3);
  return bVar12;
}

Assistant:

PBRT_CPU_GPU auto operator-(const Point3<U> &p) const
        -> Vector3<decltype(T{} - U{})> {
        DCHECK(!p.HasNaN());
        return {x - p.x, y - p.y, z - p.z};
    }